

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemdelegate.cpp
# Opt level: O1

void __thiscall
QItemDelegate::drawCheck
          (QItemDelegate *this,QPainter *painter,QStyleOptionViewItem *option,QRect *rect,
          CheckState state)

{
  QWidget *this_00;
  QStyle *pQVar1;
  long in_FS_OFFSET;
  QStyleOptionViewItem opt;
  QStyleOptionViewItem local_100;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (((rect->x1).m_i <= (rect->x2).m_i) && ((rect->y1).m_i <= (rect->y2).m_i)) {
    memset(&local_100,0xaa,0xd0);
    QStyleOptionViewItem::QStyleOptionViewItem(&local_100,option);
    local_100.super_QStyleOption.rect.x1.m_i = (rect->x1).m_i;
    local_100.super_QStyleOption.rect.y1.m_i = (rect->y1).m_i;
    local_100.super_QStyleOption.rect.x2.m_i = (rect->x2).m_i;
    local_100.super_QStyleOption.rect.y2.m_i = (rect->y2).m_i;
    local_100.super_QStyleOption.state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
    super_QFlagsStorage<QStyle::StateFlag>.i =
         (QFlagsStorageHelper<QStyle::StateFlag,_4>)
         ((uint)local_100.super_QStyleOption.state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
                super_QFlagsStorage<QStyle::StateFlag>.i & 0xfffffeff);
    if (state < (Checked|PartiallyChecked)) {
      local_100.super_QStyleOption.state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
      super_QFlagsStorage<QStyle::StateFlag>.i =
           (QFlagsStorageHelper<QStyle::StateFlag,_4>)
           ((uint)local_100.super_QStyleOption.state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>
                  .super_QFlagsStorage<QStyle::StateFlag>.i |
           *(uint *)(&DAT_006fbdf8 + (ulong)state * 4));
    }
    this_00 = option->widget;
    if (this_00 == (QWidget *)0x0) {
      pQVar1 = QApplication::style();
    }
    else {
      pQVar1 = QWidget::style(this_00);
    }
    (**(code **)(*(long *)pQVar1 + 0xb0))(pQVar1,0x19,&local_100,painter,this_00);
    QBrush::~QBrush(&local_100.backgroundBrush);
    if (&(local_100.text.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_100.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_100.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
      ;
      UNLOCK();
      if (((local_100.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
      {
        QArrayData::deallocate(&(local_100.text.d.d)->super_QArrayData,2,0x10);
      }
    }
    QIcon::~QIcon(&local_100.icon);
    QLocale::~QLocale(&local_100.locale);
    QFont::~QFont(&local_100.font);
    QStyleOption::~QStyleOption(&local_100.super_QStyleOption);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QItemDelegate::drawCheck(QPainter *painter,
                              const QStyleOptionViewItem &option,
                              const QRect &rect, Qt::CheckState state) const
{
    Q_D(const QItemDelegate);
    if (!rect.isValid())
        return;

    QStyleOptionViewItem opt(option);
    opt.rect = rect;
    opt.state = opt.state & ~QStyle::State_HasFocus;

    switch (state) {
    case Qt::Unchecked:
        opt.state |= QStyle::State_Off;
        break;
    case Qt::PartiallyChecked:
        opt.state |= QStyle::State_NoChange;
        break;
    case Qt::Checked:
        opt.state |= QStyle::State_On;
        break;
    }

    const QWidget *widget = d->widget(option);
    QStyle *style = widget ? widget->style() : QApplication::style();
    style->drawPrimitive(QStyle::PE_IndicatorItemViewItemCheck, &opt, painter, widget);
}